

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# socketio_berkeley.c
# Opt level: O0

int get_network_interface_descriptions(int socket,NETWORK_INTERFACE_DESCRIPTION **nid)

{
  int iVar1;
  LOGGER_LOG p_Var2;
  int *piVar3;
  ifreq *piVar4;
  LOGGER_LOG l_4;
  LOGGER_LOG l_3;
  LOGGER_LOG l_2;
  LOGGER_LOG l_1;
  ifreq *end;
  ifreq *it;
  NETWORK_INTERFACE_DESCRIPTION *new_nid;
  NETWORK_INTERFACE_DESCRIPTION *root_nid;
  LOGGER_LOG l;
  char buf [1024];
  ifconf ifc;
  ifreq ifr;
  int result;
  NETWORK_INTERFACE_DESCRIPTION **nid_local;
  int socket_local;
  
  buf[0x3f8] = '\0';
  buf[0x3f9] = '\x04';
  buf[0x3fa] = '\0';
  buf[0x3fb] = '\0';
  ifc._0_8_ = &l;
  iVar1 = ioctl(socket,0x8912,buf + 0x3f8);
  if (iVar1 == -1) {
    p_Var2 = xlogging_get_log_function();
    if (p_Var2 != (LOGGER_LOG)0x0) {
      piVar3 = __errno_location();
      (*p_Var2)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/c-utility/adapters/socketio_berkeley.c"
                ,"get_network_interface_descriptions",0x198,1,
                "ioctl failed querying socket (SIOCGIFCONF, errno=%d)",*piVar3);
    }
    ifr.ifr_ifru._20_4_ = 0x199;
  }
  else {
    new_nid = (NETWORK_INTERFACE_DESCRIPTION *)0x0;
    it = (ifreq *)0x0;
    piVar4 = (ifreq *)(ifc._0_8_ + ((ulong)(long)(int)buf._1016_4_ / 0x28) * 0x28);
    ifr.ifr_ifru._20_4_ = 0;
    for (end = (ifreq *)ifc._0_8_; end != piVar4; end = end + 1) {
      strcpy((char *)&ifc.ifc_ifcu,(char *)end);
      iVar1 = ioctl(socket,0x8913,&ifc.ifc_ifcu);
      if (iVar1 != 0) {
        p_Var2 = xlogging_get_log_function();
        if (p_Var2 != (LOGGER_LOG)0x0) {
          piVar3 = __errno_location();
          (*p_Var2)(AZ_LOG_ERROR,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/c-utility/adapters/socketio_berkeley.c"
                    ,"get_network_interface_descriptions",0x1ab,1,
                    "ioctl failed querying socket (SIOCGIFFLAGS, errno=%d)",*piVar3);
        }
        ifr.ifr_ifru._20_4_ = 0x1ac;
        break;
      }
      iVar1 = ioctl(socket,0x8927,&ifc.ifc_ifcu);
      if (iVar1 != 0) {
        p_Var2 = xlogging_get_log_function();
        if (p_Var2 != (LOGGER_LOG)0x0) {
          piVar3 = __errno_location();
          (*p_Var2)(AZ_LOG_ERROR,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/c-utility/adapters/socketio_berkeley.c"
                    ,"get_network_interface_descriptions",0x1b1,1,
                    "ioctl failed querying socket (SIOCGIFHWADDR, errno=%d)",*piVar3);
        }
        ifr.ifr_ifru._20_4_ = 0x1b2;
        break;
      }
      iVar1 = ioctl(socket,0x8915,&ifc.ifc_ifcu);
      if (iVar1 != 0) {
        p_Var2 = xlogging_get_log_function();
        if (p_Var2 != (LOGGER_LOG)0x0) {
          piVar3 = __errno_location();
          (*p_Var2)(AZ_LOG_ERROR,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/c-utility/adapters/socketio_berkeley.c"
                    ,"get_network_interface_descriptions",0x1b7,1,
                    "ioctl failed querying socket (SIOCGIFADDR, errno=%d)",*piVar3);
        }
        ifr.ifr_ifru._20_4_ = 0x1b8;
        break;
      }
      it = (ifreq *)create_network_interface_description
                              ((ifreq *)&ifc.ifc_ifcu,(NETWORK_INTERFACE_DESCRIPTION *)it);
      if (it == (ifreq *)0x0) {
        p_Var2 = xlogging_get_log_function();
        if (p_Var2 != (LOGGER_LOG)0x0) {
          (*p_Var2)(AZ_LOG_ERROR,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/c-utility/adapters/socketio_berkeley.c"
                    ,"get_network_interface_descriptions",0x1bd,1,
                    "Failed creating network interface description");
        }
        ifr.ifr_ifru._20_4_ = 0x1be;
        break;
      }
      if (new_nid == (NETWORK_INTERFACE_DESCRIPTION *)0x0) {
        new_nid = (NETWORK_INTERFACE_DESCRIPTION *)it;
      }
    }
    if (ifr.ifr_ifru._20_4_ == 0) {
      *nid = new_nid;
    }
    else {
      destroy_network_interface_descriptions(new_nid);
    }
  }
  return ifr.ifr_ifru._20_4_;
}

Assistant:

static int get_network_interface_descriptions(int socket, NETWORK_INTERFACE_DESCRIPTION** nid)
{
    int result;

    struct ifreq ifr;
    struct ifconf ifc;
    char buf[IFREQ_BUFFER_SIZE];

    ifc.ifc_len = sizeof(buf);
    ifc.ifc_buf = buf;

    if (ioctl(socket, SIOCGIFCONF, &ifc) == -1)
    {
        LogError("ioctl failed querying socket (SIOCGIFCONF, errno=%d)", errno);
        result = MU_FAILURE;
    }
    else
    {
        NETWORK_INTERFACE_DESCRIPTION* root_nid = NULL;
        NETWORK_INTERFACE_DESCRIPTION* new_nid = NULL;

        struct ifreq* it = ifc.ifc_req;
        const struct ifreq* const end = it + (ifc.ifc_len / sizeof(struct ifreq));

        result = 0;

        for (; it != end; ++it)
        {
            strcpy(ifr.ifr_name, it->ifr_name);

            if (ioctl(socket, SIOCGIFFLAGS, &ifr) != 0)
            {
                LogError("ioctl failed querying socket (SIOCGIFFLAGS, errno=%d)", errno);
                result = MU_FAILURE;
                break;
            }
            else if (ioctl(socket, SIOCGIFHWADDR, &ifr) != 0)
            {
                LogError("ioctl failed querying socket (SIOCGIFHWADDR, errno=%d)", errno);
                result = MU_FAILURE;
                break;
            }
            else if (ioctl(socket, SIOCGIFADDR, &ifr) != 0)
            {
                LogError("ioctl failed querying socket (SIOCGIFADDR, errno=%d)", errno);
                result = MU_FAILURE;
                break;
            }
            else if ((new_nid = create_network_interface_description(&ifr, new_nid)) == NULL)
            {
                LogError("Failed creating network interface description");
                result = MU_FAILURE;
                break;
            }
            else if (root_nid == NULL)
            {
                root_nid = new_nid;
            }
        }

        if (result == 0)
        {
            *nid = root_nid;
        }
        else
        {
            destroy_network_interface_descriptions(root_nid);
        }
    }

    return result;
}